

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_semaphore.c
# Opt level: O2

int csp_bin_sem_wait(csp_bin_sem_t *sem,uint timeout)

{
  int iVar1;
  long lVar2;
  timespec ts;
  
  if (timeout == 0xffffffff) {
    iVar1 = sem_wait((sem_t *)sem);
  }
  else {
    iVar1 = clock_gettime(0,(timespec *)&ts);
    if (iVar1 != 0) {
      return -1;
    }
    ts.tv_sec = (ulong)timeout / 1000 + ts.tv_sec;
    lVar2 = (ulong)(((int)((ulong)timeout / 1000) * -1000 + timeout) * 1000000) + ts.tv_nsec;
    if (999999999 < lVar2) {
      ts.tv_sec = ts.tv_sec + 1;
    }
    ts.tv_nsec = lVar2 % 1000000000;
    iVar1 = sem_timedwait((sem_t *)sem,(timespec *)&ts);
  }
  return -(uint)(iVar1 != 0);
}

Assistant:

int csp_bin_sem_wait(csp_bin_sem_t * sem, unsigned int timeout) {

	int ret;

	if (timeout == CSP_MAX_TIMEOUT) {
		ret = sem_wait((sem_t *) sem);
	} else {
		struct timespec ts;
		if (clock_gettime(CLOCK_REALTIME, &ts)) {
			return CSP_SEMAPHORE_ERROR;
		}

		uint32_t sec = timeout / 1000;
		uint32_t nsec = (timeout - 1000 * sec) * 1000000;

		ts.tv_sec += sec;

		if (ts.tv_nsec + nsec >= 1000000000) {
			ts.tv_sec++;
		}

		ts.tv_nsec = (ts.tv_nsec + nsec) % 1000000000;

		ret = sem_timedwait((sem_t *) sem, &ts);
	}

	if (ret != 0)
		return CSP_SEMAPHORE_ERROR;

	return CSP_SEMAPHORE_OK;
}